

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::ChooseInitialSites(S2Builder *this,S2PointIndex<int> *site_index)

{
  undefined8 this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference ppVar4;
  reference point;
  S2Point *pSVar5;
  size_type sVar6;
  bool local_4cd;
  bool local_4b9;
  int local_4a4;
  double local_4a0;
  reference local_498;
  Result *result;
  iterator __end2;
  iterator __begin2;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  *__range2;
  undefined1 local_470 [7];
  bool add_site;
  S2ClosestPointQueryPointTarget target;
  S2Point site;
  S2Point *vertex;
  InputVertexKey *key;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> local_408;
  vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> *local_3f0;
  vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> *__range1;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  results;
  S2ClosestPointQuery<int> site_query;
  undefined1 local_38 [8];
  S2ClosestPointQueryOptions options;
  S2PointIndex<int> *site_index_local;
  S2Builder *this_local;
  
  options.super_S2ClosestPointQueryBaseOptions<S2MinDistance>._24_8_ = site_index;
  S2ClosestPointQueryOptions::S2ClosestPointQueryOptions((S2ClosestPointQueryOptions *)local_38);
  S2ClosestPointQueryOptions::set_conservative_max_distance
            ((S2ClosestPointQueryOptions *)local_38,
             (S1ChordAngle)(this->min_site_separation_ca_).length2_);
  S2ClosestPointQuery<int>::S2ClosestPointQuery
            ((S2ClosestPointQuery<int> *)
             &results.
              super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Index *)options.super_S2ClosestPointQueryBaseOptions<S2MinDistance>._24_8_,
             (S2ClosestPointQueryOptions *)local_38);
  std::
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ::vector((vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
            *)&__range1);
  SortInputVertices(&local_408,this);
  local_3f0 = &local_408;
  __end1 = std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::begin
                     (local_3f0);
  key = (InputVertexKey *)
        std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::end
                  (local_3f0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<S2CellId,_int>_*,_std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>_>
                                *)&key);
    if (!bVar1) break;
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<S2CellId,_int>_*,_std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>_>
             ::operator*(&__end1);
    point = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                      (&this->input_vertices_,(long)ppVar4->second);
    SnapSite((S2Point *)(target.super_S2MinDistancePointTarget.point_.c_ + 2),this,point);
    local_4b9 = true;
    if ((this->snapping_needed_ & 1U) == 0) {
      local_4b9 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                            ((BasicVector<Vector3,_double,_3UL> *)
                             (target.super_S2MinDistancePointTarget.point_.c_ + 2),point);
    }
    this->snapping_needed_ = local_4b9;
    S2ClosestPointQueryPointTarget::S2ClosestPointQueryPointTarget
              ((S2ClosestPointQueryPointTarget *)local_470,
               (S2Point *)(target.super_S2MinDistancePointTarget.point_.c_ + 2));
    S2ClosestPointQuery<int>::FindClosestPoints
              ((S2ClosestPointQuery<int> *)
               &results.
                super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Target *)local_470,
               (vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                *)&__range1);
    bVar1 = true;
    __end2 = std::
             vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
             ::begin((vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                      *)&__range1);
    result = (Result *)
             std::
             vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
             ::end((vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                    *)&__range1);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result_*,_std::vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>_>
                                  *)&result);
      this_00 = options.super_S2ClosestPointQueryBaseOptions<S2MinDistance>._24_8_;
      if (!bVar2) break;
      local_498 = __gnu_cxx::
                  __normal_iterator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result_*,_std::vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>_>
                  ::operator*(&__end2);
      pSVar5 = S2ClosestPointQueryBase<S2MinDistance,_int>::Result::point(local_498);
      local_4a0 = (this->min_site_separation_ca_).length2_;
      iVar3 = s2pred::CompareDistance
                        ((S2Point *)(target.super_S2MinDistancePointTarget.point_.c_ + 2),pSVar5,
                         (S1ChordAngle)local_4a0);
      if (iVar3 < 1) {
        bVar1 = false;
        local_4cd = true;
        if ((this->snapping_needed_ & 1U) == 0) {
          pSVar5 = S2ClosestPointQueryBase<S2MinDistance,_int>::Result::point(local_498);
          local_4cd = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                                ((BasicVector<Vector3,_double,_3UL> *)
                                 (target.super_S2MinDistancePointTarget.point_.c_ + 2),pSVar5);
        }
        this->snapping_needed_ = local_4cd;
      }
      __gnu_cxx::
      __normal_iterator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result_*,_std::vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>_>
      ::operator++(&__end2);
    }
    if (bVar1) {
      sVar6 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size(&this->sites_);
      local_4a4 = (int)sVar6;
      S2PointIndex<int>::Add
                ((S2PointIndex<int> *)this_00,
                 (S2Point *)(target.super_S2MinDistancePointTarget.point_.c_ + 2),&local_4a4);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
                (&this->sites_,(value_type *)(target.super_S2MinDistancePointTarget.point_.c_ + 2));
      S2ClosestPointQuery<int>::ReInit
                ((S2ClosestPointQuery<int> *)
                 &results.
                  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    S2ClosestPointQueryPointTarget::~S2ClosestPointQueryPointTarget
              ((S2ClosestPointQueryPointTarget *)local_470);
    __gnu_cxx::
    __normal_iterator<std::pair<S2CellId,_int>_*,_std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::~vector
            (&local_408);
  std::
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ::~vector((vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
             *)&__range1);
  S2ClosestPointQuery<int>::~S2ClosestPointQuery
            ((S2ClosestPointQuery<int> *)
             &results.
              super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void S2Builder::ChooseInitialSites(S2PointIndex<SiteId>* site_index) {
  // Find all points whose distance is <= min_site_separation_ca_.
  S2ClosestPointQueryOptions options;
  options.set_conservative_max_distance(min_site_separation_ca_);
  S2ClosestPointQuery<SiteId> site_query(site_index, options);
  vector<S2ClosestPointQuery<SiteId>::Result> results;

  // Apply the snap_function() to each input vertex, then check whether any
  // existing site is closer than min_vertex_separation().  If not, then add a
  // new site.
  //
  // NOTE(ericv): There are actually two reasonable algorithms, which we call
  // "snap first" (the one above) and "snap last".  The latter checks for each
  // input vertex whether any existing site is closer than snap_radius(), and
  // only then applies the snap_function() and adds a new site.  "Snap last"
  // can yield slightly fewer sites in some cases, but it is also more
  // expensive and can produce surprising results.  For example, if you snap
  // the polyline "0:0, 0:0.7" using IntLatLngSnapFunction(0), the result is
  // "0:0, 0:0" rather than the expected "0:0, 0:1", because the snap radius
  // is approximately sqrt(2) degrees and therefore it is legal to snap both
  // input points to "0:0".  "Snap first" produces "0:0, 0:1" as expected.
  for (const InputVertexKey& key : SortInputVertices()) {
    const S2Point& vertex = input_vertices_[key.second];
    S2Point site = SnapSite(vertex);
    // If any vertex moves when snapped, the output cannot be idempotent.
    snapping_needed_ = snapping_needed_ || site != vertex;

    // FindClosestPoints() measures distances conservatively, so we need to
    // recheck the distances using exact predicates.
    //
    // NOTE(ericv): When the snap radius is large compared to the average
    // vertex spacing, we could possibly avoid the call the FindClosestPoints
    // by checking whether sites_.back() is close enough.
    S2ClosestPointQueryPointTarget target(site);
    site_query.FindClosestPoints(&target, &results);
    bool add_site = true;
    for (const auto& result : results) {
      if (s2pred::CompareDistance(site, result.point(),
                                  min_site_separation_ca_) <= 0) {
        add_site = false;
        // This pair of sites is too close.  If the sites are distinct, then
        // the output cannot be idempotent.
        snapping_needed_ = snapping_needed_ || site != result.point();
      }
    }
    if (add_site) {
      site_index->Add(site, sites_.size());
      sites_.push_back(site);
      site_query.ReInit();
    }
  }
}